

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

xlik_css_object xlik_css_init(int p,int d,int q,int s,int P,int D,int Q,int M,int N)

{
  int iVar1;
  xlik_css_object pxVar2;
  double dVar3;
  int local_30;
  int t;
  int r;
  int i;
  xlik_css_object obj;
  int D_local;
  int P_local;
  int s_local;
  int q_local;
  int d_local;
  int p_local;
  
  local_30 = p + s * P;
  iVar1 = q + s * Q + 1;
  if (local_30 < iVar1) {
    local_30 = iVar1;
  }
  pxVar2 = (xlik_css_object)malloc((long)local_30 * 0x10 + 0x68 + (long)(M + 3) * 8 * (long)N);
  pxVar2->p = p;
  pxVar2->d = d;
  pxVar2->q = q;
  pxVar2->s = s;
  pxVar2->P = P;
  pxVar2->D = D;
  pxVar2->Q = Q;
  pxVar2->M = M;
  pxVar2->N = N;
  pxVar2->Nmncond = N;
  pxVar2->length = N;
  pxVar2->pq = p + q + P + Q + M;
  pxVar2->r = p + s * P;
  iVar1 = q + 1 + s * Q;
  if (pxVar2->r < iVar1) {
    pxVar2->r = iVar1;
  }
  iVar1 = pxVar2->r;
  pxVar2->offset = pxVar2->r << 1;
  for (t = 0; t < iVar1; t = t + 1) {
    pxVar2->x[t] = 0.0;
  }
  for (t = 0; t < iVar1; t = t + 1) {
    pxVar2->x[t + local_30] = 0.0;
  }
  dVar3 = macheps();
  pxVar2->eps = dVar3;
  pxVar2->mean = 0.0;
  return pxVar2;
}

Assistant:

xlik_css_object xlik_css_init(int p, int d, int q, int s, int P, int D, int Q,int M, int N) {
	xlik_css_object obj = NULL;
	int i, r, t;

	r = p + s*P;

	t = q + s*Q + 1;

	if (r < t) {
		r = t;
	}
	else {
		t = r;
	}

	obj = (xlik_css_object)malloc(sizeof(struct xlik_css_set) + sizeof(double)* 2 * r + sizeof(double)* (3+M) * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->M = M; // This will include the mean term and the exogenous terms
	obj->N = N;
	obj->Nmncond = N;
	obj->length = N;
	obj->pq = p + q + P + Q + M;

	obj->r = p + s * P;

	t = 1 + q + s*Q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	obj->offset = 2 * obj->r;

	for (i = 0; i < t; ++i) {
		obj->x[i] = 0.0;// phi
	}

	for (i = 0; i < t; ++i) {
		obj->x[i + r] = 0.0;//theta
	}
	obj->eps = macheps();
	obj->mean = 0.0;

	return obj;
}